

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::clearAllFiles(FileServer *this)

{
  int iVar1;
  bool bVar2;
  pointer pIVar3;
  size_type sVar4;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  reference rVar5;
  FileData *file;
  iterator __end2;
  iterator __begin2;
  vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_> *__range2;
  int i;
  lock_guard<std::mutex> lock;
  FileData *in_stack_fffffffffffffee8;
  FileData *in_stack_fffffffffffffef0;
  size_type in_stack_ffffffffffffff08;
  string *this_00;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff10;
  allocator *paVar6;
  allocator local_c2;
  allocator local_c1;
  string local_c0 [32];
  undefined8 local_a0;
  undefined1 auStack_98 [64];
  reference local_58;
  FileData *local_50;
  __normal_iterator<GGSock::FileServer::FileData_*,_std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>_>
  local_48;
  vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_> *local_40;
  reference local_28;
  int local_14;
  
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x1358f1);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)in_stack_fffffffffffffee8);
  pIVar3 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x135912);
  pIVar3->currentFileUpdateId = 0;
  local_14 = 0;
  while( true ) {
    iVar1 = local_14;
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x135939);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(in_RDI);
    if ((int)sVar4 <= iVar1) break;
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x13595e);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_28 = rVar5;
    std::_Bit_reference::operator=(&local_28,false);
    local_14 = local_14 + 1;
  }
  pIVar3 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x1359e0);
  local_40 = &pIVar3->files;
  local_48._M_current =
       (FileData *)
       std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::
       begin(in_stack_fffffffffffffee8);
  local_50 = (FileData *)
             std::
             vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::
             end((vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                  *)in_stack_fffffffffffffee8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<GGSock::FileServer::FileData_*,_std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<GGSock::FileServer::FileData_*,_std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar2) break;
    local_58 = __gnu_cxx::
               __normal_iterator<GGSock::FileServer::FileData_*,_std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>_>
               ::operator*(&local_48);
    this_00 = local_c0;
    paVar6 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"?",paVar6);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    local_a0 = 0;
    in_stack_fffffffffffffef0 = (FileData *)auStack_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_stack_fffffffffffffef0,"?",&local_c2);
    std::allocator<char>::~allocator((allocator<char> *)&local_c2);
    auStack_98._32_4_ = 0;
    in_stack_fffffffffffffee8 = (FileData *)(auStack_98 + 0x28);
    memset(in_stack_fffffffffffffee8,0,0x18);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x135afe);
    FileData::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    FileData::~FileData(in_stack_fffffffffffffef0);
    __gnu_cxx::
    __normal_iterator<GGSock::FileServer::FileData_*,_std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>_>
    ::operator++(&local_48);
  }
  pIVar3 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x135b80);
  pIVar3->changedFileInfos = true;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x135b91);
  return true;
}

Assistant:

bool FileServer::clearAllFiles() {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        m_impl->currentFileUpdateId = 0;
        for (int i = 0; i < (int) m_impl->fileUsed.size(); ++i) {
            m_impl->fileUsed[i] = false;
        }

        for (auto & file : m_impl->files) {
            file = {};
        }

        m_impl->changedFileInfos = true;
    }

    return true;
}